

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O1

int __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::init
          (SparseTextureClampLookupResidencyTestCase *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  iterator __position;
  pointer extraout_RAX;
  pointer pcVar3;
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  *this_00;
  FunctionToken f;
  undefined1 local_210 [32];
  _Alloc_hider local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1d0;
  undefined1 local_1a0 [32];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_160;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  local_1a0._0_4_ = 0x81a5;
  __position._M_current =
       *(pointer *)
        ((long)&(this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8);
  if (__position._M_current ==
      *(pointer *)
       ((long)&(this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10)
     ) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&(this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mSupportedInternalFormats,__position,
               (int *)local_1a0);
  }
  else {
    *__position._M_current = 0x81a5;
    *(int **)((long)&(this->super_SparseTexture2LookupTestCase).
                     super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.
                     mSupportedInternalFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl
                     .super__Vector_impl_data + 8) = __position._M_current + 1;
  }
  local_1a0._0_8_ = local_1a0 + 0x10;
  local_1a0._8_8_ = 0;
  local_1a0[0x10] = '\0';
  local_180._M_p = (pointer)&local_170;
  local_178 = 0;
  local_170._M_local_buf[0] = '\0';
  p_Var2 = &local_160._M_impl.super__Rb_tree_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_160._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"sparseTextureClampARB","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,", <LOD>","");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_210,&local_50,&local_70);
  std::__cxx11::string::operator=((string *)local_1a0,(string *)local_210);
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_160);
  if (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_1d0._M_impl.super__Rb_tree_header;
    local_160._M_impl.super__Rb_tree_header._M_header._M_color =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_160._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_160._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_160._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_160._M_impl.super__Rb_tree_header._M_node_count =
         local_1d0._M_impl.super__Rb_tree_header._M_node_count;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_p != &local_1e0) {
    operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_210 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_),local_210._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_210._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  this_00 = &(this->super_SparseTexture2LookupTestCase).mFunctions;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_00,(value_type *)local_1a0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"sparseTextureOffsetClampARB","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>","");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_210,&local_90,&local_b0);
  std::__cxx11::string::operator=((string *)local_1a0,(string *)local_210);
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_160);
  if (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_1d0._M_impl.super__Rb_tree_header;
    local_160._M_impl.super__Rb_tree_header._M_header._M_color =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_160._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_160._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_160._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_160._M_impl.super__Rb_tree_header._M_node_count =
         local_1d0._M_impl.super__Rb_tree_header._M_node_count;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_p != &local_1e0) {
    operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_210 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_),local_210._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_210._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_00,(value_type *)local_1a0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"sparseTextureGradClampARB","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>","");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_210,&local_d0,&local_f0);
  std::__cxx11::string::operator=((string *)local_1a0,(string *)local_210);
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_160);
  if (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_1d0._M_impl.super__Rb_tree_header;
    local_160._M_impl.super__Rb_tree_header._M_header._M_color =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_160._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_160._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_160._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_160._M_impl.super__Rb_tree_header._M_node_count =
         local_1d0._M_impl.super__Rb_tree_header._M_node_count;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_p != &local_1e0) {
    operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_210 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_),local_210._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_210._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_00,(value_type *)local_1a0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"sparseTextureGradOffsetClampARB","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>"
             ,"");
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken
            ((FunctionToken *)local_210,&local_110,&local_130);
  std::__cxx11::string::operator=((string *)local_1a0,(string *)local_210);
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_160);
  if (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_1d0._M_impl.super__Rb_tree_header;
    local_160._M_impl.super__Rb_tree_header._M_header._M_color =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_160._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_160._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_160._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    local_160._M_impl.super__Rb_tree_header._M_node_count =
         local_1d0._M_impl.super__Rb_tree_header._M_node_count;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_1d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_p != &local_1e0) {
    operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_210 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_),local_210._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_210._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  local_210._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_160,(int *)local_210);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_00,(value_type *)local_1a0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p,
                    CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]) + 1);
  }
  pcVar3 = local_1a0 + 0x10;
  if ((pointer)local_1a0._0_8_ != pcVar3) {
    operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
    pcVar3 = extraout_RAX;
  }
  return (int)pcVar3;
}

Assistant:

void SparseTextureClampLookupResidencyTestCase::init()
{
	SparseTextureCommitmentTestCase::init();
	mSupportedInternalFormats.push_back(GL_DEPTH_COMPONENT16);

	FunctionToken f;
	f = FunctionToken("sparseTextureClampARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureOffsetClampARB", ", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradClampARB",
					  ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken(
		"sparseTextureGradOffsetClampARB",
		", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);
}